

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Kernel::Kernel(Kernel *this,Kernel *from)

{
  void *pvVar1;
  LinearKernel *this_00;
  PolyKernel *this_01;
  SigmoidKernel *this_02;
  RBFKernel *this_03;
  PolyKernel *from_00;
  SigmoidKernel *from_01;
  LinearKernel *from_02;
  RBFKernel *from_03;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Kernel_0072bc18;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  switch(from->_oneof_case_[0]) {
  case 1:
    clear_kernel(this);
    this->_oneof_case_[0] = 1;
    this_00 = (LinearKernel *)operator_new(0x18);
    LinearKernel::LinearKernel(this_00);
    (this->kernel_).linearkernel_ = this_00;
    if (from->_oneof_case_[0] == 1) {
      from_02 = (from->kernel_).linearkernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_02 = (LinearKernel *)&_LinearKernel_default_instance_;
    }
    LinearKernel::MergeFrom(this_00,from_02);
    break;
  case 2:
    clear_kernel(this);
    this->_oneof_case_[0] = 2;
    this_03 = (RBFKernel *)operator_new(0x20);
    RBFKernel::RBFKernel(this_03);
    (this->kernel_).rbfkernel_ = this_03;
    if (from->_oneof_case_[0] == 2) {
      from_03 = (from->kernel_).rbfkernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_03 = (RBFKernel *)&_RBFKernel_default_instance_;
    }
    RBFKernel::MergeFrom(this_03,from_03);
    break;
  case 3:
    clear_kernel(this);
    this->_oneof_case_[0] = 3;
    this_01 = (PolyKernel *)operator_new(0x28);
    PolyKernel::PolyKernel(this_01);
    (this->kernel_).polykernel_ = this_01;
    if (from->_oneof_case_[0] == 3) {
      from_00 = (from->kernel_).polykernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_00 = (PolyKernel *)&_PolyKernel_default_instance_;
    }
    PolyKernel::MergeFrom(this_01,from_00);
    break;
  case 4:
    clear_kernel(this);
    this->_oneof_case_[0] = 4;
    this_02 = (SigmoidKernel *)operator_new(0x28);
    SigmoidKernel::SigmoidKernel(this_02);
    (this->kernel_).sigmoidkernel_ = this_02;
    if (from->_oneof_case_[0] == 4) {
      from_01 = (from->kernel_).sigmoidkernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_01 = (SigmoidKernel *)&_SigmoidKernel_default_instance_;
    }
    SigmoidKernel::MergeFrom(this_02,from_01);
  }
  return;
}

Assistant:

Kernel::Kernel(const Kernel& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_kernel();
  switch (from.kernel_case()) {
    case kLinearKernel: {
      mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from.linearkernel());
      break;
    }
    case kRbfKernel: {
      mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from.rbfkernel());
      break;
    }
    case kPolyKernel: {
      mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from.polykernel());
      break;
    }
    case kSigmoidKernel: {
      mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from.sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Kernel)
}